

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype __thiscall QString::count(QString *this,QString *str,CaseSensitivity cs)

{
  long lVar1;
  QChar *str_00;
  QStringView *this_00;
  qsizetype qVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000008 [16];
  QStringView in_stack_00000018;
  QStringView *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  CaseSensitivity cs_00;
  
  cs_00 = (CaseSensitivity)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = unicode((QString *)0x50f173);
  size(in_RDI);
  QStringView::QStringView<QChar,_true>(in_stack_ffffffffffffffb0,str_00,(qsizetype)in_RDI);
  this_00 = (QStringView *)unicode((QString *)0x50f19e);
  size(in_RSI);
  QStringView::QStringView<QChar,_true>(this_00,str_00,(qsizetype)in_RDI);
  qVar2 = QtPrivate::count(in_stack_00000018,(QStringView)in_stack_00000008,cs_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QString::count(const QString &str, Qt::CaseSensitivity cs) const
{
    return QtPrivate::count(QStringView(unicode(), size()), QStringView(str.unicode(), str.size()), cs);
}